

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEquationFilter.cpp
# Opt level: O0

void __thiscall
TPZEquationFilter::ScatterInternal<std::complex<double>>
          (TPZEquationFilter *this,TPZFMatrix<std::complex<double>_> *vsmall,
          TPZFMatrix<std::complex<double>_> *vexpand)

{
  bool bVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  complex<double> *pcVar5;
  TPZBaseMatrix *in_RDX;
  TPZFMatrix<std::complex<double>_> *in_RSI;
  TPZFMatrix<std::complex<double>_> *in_RDI;
  int64_t extraout_XMM0_Qa;
  TPZFMatrix<std::complex<double>_> *in_XMM1_Qa;
  int64_t i;
  int j;
  int64_t ncols;
  int64_t neqcondense;
  size_t in_stack_000003b8;
  char *in_stack_000003c0;
  TPZEquationFilter *in_stack_ffffffffffffff98;
  TPZFMatrix<std::complex<double>_> *pTVar6;
  int64_t local_38;
  int local_2c;
  
  pTVar6 = in_RDI;
  iVar2 = NActiveEquations(in_stack_ffffffffffffff98);
  iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
  if (iVar3 == iVar2) {
    iVar3 = TPZBaseMatrix::Rows(in_RDX);
    if (iVar3 == (in_RDI->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow) {
      iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
      iVar4 = TPZBaseMatrix::Cols(in_RDX);
      if (iVar3 <= iVar4) goto LAB_01e00fda;
    }
  }
  std::operator<<((ostream *)&std::cerr,
                  "void TPZEquationFilter::ScatterInternal(const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &) const [TVar = std::complex<double>]"
                 );
  std::operator<<((ostream *)&std::cerr,"\nERROR: Incompatible dimensions\nAborting...\n");
  pzinternal::DebugStopImpl(in_stack_000003c0,in_stack_000003b8);
LAB_01e00fda:
  bVar1 = IsActive((TPZEquationFilter *)in_RDI);
  if (bVar1) {
    (*(in_RDX->super_TPZSavable)._vptr_TPZSavable[0xf])();
    iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
    for (local_2c = 0; local_2c < iVar3; local_2c = local_2c + 1) {
      for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
        (*(in_RSI->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x24])(in_RSI,local_38,(long)local_2c);
        iVar4 = extraout_XMM0_Qa;
        pTVar6 = in_XMM1_Qa;
        TPZVec<long>::operator[]
                  ((TPZVec<long> *)
                   &(in_RDI->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed
                   ,local_38);
        pcVar5 = TPZFMatrix<std::complex<double>_>::operator()(pTVar6,iVar4,(int64_t)in_RDI);
        *(int64_t *)pcVar5->_M_value = iVar4;
        *(TPZFMatrix<std::complex<double>_> **)(pcVar5->_M_value + 8) = pTVar6;
      }
    }
  }
  else {
    TPZFMatrix<std::complex<double>_>::operator=(pTVar6,in_RSI);
  }
  return;
}

Assistant:

void TPZEquationFilter::ScatterInternal(const TPZFMatrix<TVar> &vsmall,
                     TPZFMatrix<TVar> &vexpand) const {
  int64_t neqcondense = this->NActiveEquations();
  if (vsmall.Rows() != neqcondense || vexpand.Rows() != fNumEq ||
      vsmall.Cols() > vexpand.Cols()) {
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Incompatible dimensions\nAborting...\n";
    DebugStop();
  }
  if (!IsActive()) {
    vexpand = vsmall;
    return;
  }
  vexpand.Zero();

#ifdef PZDEBUG
  {
    for (int64_t i = 0; i < neqcondense; i++) {
      if (fActiveEqs[i] >= fNumEq) {
        DebugStop();
      }
    }
  }
#endif
  const auto ncols = vsmall.Cols();
  for(auto j = 0; j < ncols; j++)
    for (int64_t i = 0; i < neqcondense; i++)
      vexpand(fActiveEqs[i], j) = vsmall.GetVal(i, j);
}